

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::MethodDescriptor::DebugString
          (MethodDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  ushort *puVar1;
  FeatureSet *from;
  _func_int **pp_Var2;
  undefined8 uVar3;
  undefined8 output;
  Descriptor *pDVar4;
  Arena *pAVar5;
  InternalMetadata arena;
  char *pcVar6;
  AllocatedData AVar7;
  bool bVar8;
  string_view format;
  string_view format_00;
  string prefix;
  string formatted_options;
  SourceLocationCommentPrinter comment_printer;
  MethodOptions full_options;
  Arena *local_1a8;
  _func_int **local_1a0;
  undefined1 local_198 [48];
  atomic<char_*> local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined1 local_150 [120];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  MethodOptions local_b8;
  char *local_60;
  __base_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  _func_int **local_48;
  Arena *local_40;
  
  local_1a8 = (Arena *)local_198;
  std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)depth * '\x02');
  local_150._24_8_ = local_150 + 0x28;
  local_150._32_8_ = (__pointer_type)0x0;
  local_150[0x28] = '\0';
  local_150._56_8_ = (long)local_150 + 0x48;
  local_150._64_8_ = 0;
  local_150[0x48] = '\0';
  local_150._88_8_ = (pointer)0x0;
  local_150._96_8_ = (pointer)0x0;
  local_150._104_8_ = (pointer)0x0;
  local_150[0x70] = debug_string_options->include_comments;
  local_150[0x71] = debug_string_options->elide_group_body;
  local_150[0x72] = debug_string_options->elide_oneof_body;
  local_d8._M_p = (pointer)&local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_1a8,(undefined1 *)((long)local_1a0 + (long)local_1a8));
  if (debug_string_options->include_comments == true) {
    local_150[0] = GetSourceLocation(this,(SourceLocation *)(local_150 + 8));
  }
  else {
    local_150[0] = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_150,contents);
  pp_Var2 = local_1a0;
  local_198._24_8_ = local_1a8;
  puVar1 = (ushort *)(this->all_names_).payload_;
  pAVar5 = (Arena *)(ulong)*puVar1;
  local_198._16_8_ = (ulong)(uint)depth;
  local_198._32_8_ = contents;
  pDVar4 = input_type(this);
  pcVar6 = (pDVar4->all_names_).payload_;
  AVar7._2_6_ = 0;
  AVar7._0_2_ = *(ushort *)(pcVar6 + 2);
  pDVar4 = output_type(this);
  output = local_198._32_8_;
  local_b8.field_0._8_8_ = (long)puVar1 + ~(ulong)pAVar5;
  local_b8.field_0._24_8_ = pcVar6 + ~(ulong)AVar7.flat;
  pcVar6 = (pDVar4->all_names_).payload_;
  local_b8.field_0._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_ =
       (void *)(ulong)*(ushort *)(pcVar6 + 2);
  local_b8.field_0._40_8_ =
       pcVar6 + ~(ulong)local_b8.field_0._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.
                        tagged_rep_or_elem_;
  local_b8.field_0._64_8_ = 0;
  bVar8 = this->client_streaming_ != false;
  local_60 = "";
  pcVar6 = "";
  if (bVar8) {
    pcVar6 = "stream ";
  }
  local_b8.field_0._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  if (bVar8) {
    local_b8.field_0._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x7;
  }
  if (this->server_streaming_ != false) {
    local_60 = "stream ";
    local_b8.field_0._64_8_ = 7;
  }
  local_b8.super_Message.super_MessageLite._vptr_MessageLite = pp_Var2;
  local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ = local_198._24_8_;
  format._M_str = (char *)&local_b8;
  format._M_len = (size_t)"$0rpc $1($4.$2) returns ($5.$3)";
  local_b8.field_0._impl_._extensions_.arena_ = pAVar5;
  local_b8.field_0._impl_._extensions_.map_ = AVar7;
  local_b8.field_0._impl_.features_ = (FeatureSet *)pcVar6;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)local_198._32_8_,(Nonnull<std::string_*>)0x1f,format,
             (Nullable<const_absl::string_view_*>)&DAT_00000006,(size_t)pcVar6);
  MethodOptions::MethodOptions(&local_b8,(Arena *)0x0,this->options_);
  uVar3 = local_198._16_8_;
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    local_b8.field_0._24_8_ = local_b8.field_0._24_8_ | 1;
    if (local_b8.field_0._impl_.features_ == (FeatureSet *)0x0) {
      arena.ptr_ = local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_;
      if ((local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        arena.ptr_ = *(undefined8 *)
                      (local_b8.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                      0xfffffffffffffffe);
      }
      local_b8.field_0._impl_.features_ =
           (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)arena.ptr_);
    }
    FeatureSet::CopyFrom(local_b8.field_0._impl_.features_,from);
  }
  local_168._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_160._M_local_buf[0] = '\0';
  local_198._40_8_ = &local_160;
  bVar8 = anon_unknown_24::FormatLineOptions
                    ((int)uVar3 + 1,&local_b8.super_Message,this->service_->file_->pool_,
                     (string *)(local_198 + 0x28));
  if (bVar8) {
    local_58 = local_168._M_b._M_p;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_198._40_8_;
    local_48 = local_1a0;
    local_40 = local_1a8;
    format_00._M_str = (char *)&local_58;
    format_00._M_len = (size_t)" {\n$0$1}\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)output,(Nonnull<std::string_*>)0x9,format_00,
               (Nullable<const_absl::string_view_*>)0x2,(size_t)pcVar6);
  }
  else {
    std::__cxx11::string::append((char *)output);
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_150,(string *)output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._40_8_ != &local_160) {
    operator_delete((void *)local_198._40_8_,
                    CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
  }
  MethodOptions::~MethodOptions(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_150 + 0x58));
  if (local_150._56_8_ != (long)local_150 + 0x48U) {
    operator_delete((void *)local_150._56_8_,CONCAT71(local_150._73_7_,local_150[0x48]) + 1);
  }
  if ((undefined1 *)local_150._24_8_ != local_150 + 0x28) {
    operator_delete((void *)local_150._24_8_,CONCAT71(local_150._41_7_,local_150[0x28]) + 1);
  }
  if (local_1a8 != (Arena *)local_198) {
    operator_delete(local_1a8,local_198._0_8_ + 1);
  }
  return;
}

Assistant:

void MethodDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(
      contents, "$0rpc $1($4.$2) returns ($5.$3)", prefix, name(),
      input_type()->full_name(), output_type()->full_name(),
      client_streaming() ? "stream " : "", server_streaming() ? "stream " : "");

  MethodOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  std::string formatted_options;
  if (FormatLineOptions(depth, full_options, service()->file()->pool(),
                        &formatted_options)) {
    absl::SubstituteAndAppend(contents, " {\n$0$1}\n", formatted_options,
                              prefix);
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}